

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkForce.cpp
# Opt level: O3

void __thiscall chrono::ChLinkForce::ArchiveIN(ChLinkForce *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkForce>(marchive);
  local_38._name = "m_active";
  local_38._flags = '\0';
  local_38._value = (shared_ptr<chrono::ChFunction> *)this;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_F;
  local_38._name = "m_F";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->m_F_modul;
  local_38._name = "m_F_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_K;
  local_38._name = "m_K";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->m_K_modul;
  local_38._name = "m_K_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_R;
  local_38._name = "m_R";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->m_R_modul;
  local_38._name = "m_R_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkForce::ArchiveIN(ChArchiveIn& marchive) {
    // class version number
    /*int version =*/ marchive.VersionRead<ChLinkForce>();

    // stream in all member data
    marchive >> CHNVP(m_active);
    marchive >> CHNVP(m_F);
    marchive >> CHNVP(m_F_modul);
    marchive >> CHNVP(m_K);
    marchive >> CHNVP(m_K_modul);
    marchive >> CHNVP(m_R);
    marchive >> CHNVP(m_R_modul);
}